

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_mDCV_fixed
               (png_structrp png_ptr,png_uint_16 red_x,png_uint_16 red_y,png_uint_16 green_x,
               png_uint_16 green_y,png_uint_16 blue_x,png_uint_16 blue_y,png_uint_16 white_x,
               png_uint_16 white_y,png_uint_32 maxDL,png_uint_32 minDL)

{
  png_byte buf [24];
  
  buf[0] = (png_byte)(red_x >> 8);
  buf[1] = (png_byte)red_x;
  buf[2] = (png_byte)(red_y >> 8);
  buf[3] = (png_byte)red_y;
  buf[4] = (png_byte)(green_x >> 8);
  buf[5] = (png_byte)green_x;
  buf[6] = (png_byte)(green_y >> 8);
  buf[7] = (png_byte)green_y;
  buf[8] = (png_byte)(blue_x >> 8);
  buf[9] = (png_byte)blue_x;
  buf[10] = (png_byte)(blue_y >> 8);
  buf[0xb] = (png_byte)blue_y;
  buf[0xc] = (png_byte)(white_x >> 8);
  buf[0xd] = (png_byte)white_x;
  buf[0xe] = (png_byte)(white_y >> 8);
  buf[0xf] = (png_byte)white_y;
  buf[0x10] = (png_byte)(maxDL >> 0x18);
  buf[0x11] = (png_byte)(maxDL >> 0x10);
  buf[0x12] = (png_byte)(maxDL >> 8);
  buf[0x13] = (png_byte)maxDL;
  buf[0x14] = (png_byte)(minDL >> 0x18);
  buf[0x15] = (png_byte)(minDL >> 0x10);
  buf[0x16] = (png_byte)(minDL >> 8);
  buf[0x17] = (png_byte)minDL;
  png_write_complete_chunk(png_ptr,0x6d444356,buf,0x18);
  return;
}

Assistant:

void /* PRIVATE */
png_write_mDCV_fixed(png_structrp png_ptr,
   png_uint_16 red_x, png_uint_16 red_y,
   png_uint_16 green_x, png_uint_16 green_y,
   png_uint_16 blue_x, png_uint_16 blue_y,
   png_uint_16 white_x, png_uint_16 white_y,
   png_uint_32 maxDL, png_uint_32 minDL)
{
   png_byte buf[24];

   png_debug(1, "in png_write_mDCV_fixed");

   png_save_uint_16(buf +  0, red_x);
   png_save_uint_16(buf +  2, red_y);
   png_save_uint_16(buf +  4, green_x);
   png_save_uint_16(buf +  6, green_y);
   png_save_uint_16(buf +  8, blue_x);
   png_save_uint_16(buf + 10, blue_y);
   png_save_uint_16(buf + 12, white_x);
   png_save_uint_16(buf + 14, white_y);
   png_save_uint_32(buf + 16, maxDL);
   png_save_uint_32(buf + 20, minDL);

   png_write_complete_chunk(png_ptr, png_mDCV, buf, 24);
}